

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O0

arg_t ** arg_sort(arg_t *defn,int32 n)

{
  arg_t **__base;
  int local_24;
  int32 i;
  arg_t **pos;
  int32 n_local;
  arg_t *defn_local;
  
  __base = (arg_t **)
           __ckd_calloc__((long)n,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                          ,0x95);
  for (local_24 = 0; local_24 < n; local_24 = local_24 + 1) {
    __base[local_24] = defn + local_24;
  }
  qsort(__base,(long)n,8,cmp_name);
  return __base;
}

Assistant:

static arg_t const **
arg_sort(const arg_t * defn, int32 n)
{
    const arg_t ** pos;
    int32 i;

    pos = (arg_t const **) ckd_calloc(n, sizeof(arg_t *));
    for (i = 0; i < n; ++i)
        pos[i] = &defn[i];
    qsort(pos, n, sizeof(arg_t *), cmp_name);

    return pos;
}